

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O3

Continuation * scm::trampoline::displayFunction(void)

{
  Verbosity VVar1;
  uint uVar2;
  ostream *poVar3;
  Continuation *pCVar4;
  int n;
  Object *extraout_RDX;
  Object *extraout_RDX_00;
  Object *extraout_RDX_01;
  Object *obj;
  pointer ppOVar5;
  double __x;
  ObjectVec arguments;
  string local_60;
  vector<scm::Object_*,_std::allocator<scm::Object_*>_> local_40;
  
  VVar1 = loguru::current_verbosity_cutoff();
  if ((-1 < VVar1) && (LOG_TRAMPOLINE_TRACE != '\0')) {
    loguru::log(__x);
  }
  uVar2 = popArg<int>();
  popArgs<scm::Object*>(&local_40,(trampoline *)(ulong)uVar2,n);
  if (local_40.super__Vector_base<scm::Object_*,_std::allocator<scm::Object_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_40.super__Vector_base<scm::Object_*,_std::allocator<scm::Object_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    obj = extraout_RDX;
    ppOVar5 = local_40.super__Vector_base<scm::Object_*,_std::allocator<scm::Object_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    do {
      toString_abi_cxx11_(&local_60,(scm *)ppOVar5[-1],obj);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,
                          (char *)CONCAT71(local_60._M_dataplus._M_p._1_7_,
                                           local_60._M_dataplus._M_p._0_1_),
                          local_60._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      obj = extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_60._M_dataplus._M_p._1_7_,local_60._M_dataplus._M_p._0_1_) !=
          &local_60.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_60._M_dataplus._M_p._1_7_,local_60._M_dataplus._M_p._0_1_),
                        local_60.field_2._M_allocated_capacity + 1);
        obj = extraout_RDX_01;
      }
      ppOVar5 = ppOVar5 + -1;
    } while (ppOVar5 !=
             local_40.super__Vector_base<scm::Object_*,_std::allocator<scm::Object_*>_>._M_impl.
             super__Vector_impl_data._M_start);
  }
  local_60._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_60,1);
  lastReturnValue = SCM_VOID;
  pCVar4 = popFunc();
  if (local_40.super__Vector_base<scm::Object_*,_std::allocator<scm::Object_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<scm::Object_*,_std::allocator<scm::Object_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<scm::Object_*,_std::allocator<scm::Object_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<scm::Object_*,_std::allocator<scm::Object_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pCVar4;
}

Assistant:

Continuation* displayFunction()
{
  DLOG_IF_F(INFO, LOG_TRAMPOLINE_TRACE, "in: displayFunction");
  int nArgs{popArg<int>()};
  ObjectVec arguments{popArgs<Object*>(nArgs)};
  for (auto argument{arguments.rbegin()}; argument != arguments.rend(); argument++) {
    std::cout << toString(*argument) << " ";
  }
  std::cout << '\n';
  t_RETURN(SCM_VOID);
}